

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O0

void Curl_cookie_loadfiles(Curl_easy *data)

{
  CookieInfo *pCVar1;
  CookieInfo *newcookies;
  curl_slist *list;
  Curl_easy *data_local;
  
  newcookies = (CookieInfo *)(data->state).cookielist;
  if (newcookies != (CookieInfo *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
    for (; newcookies != (CookieInfo *)0x0; newcookies = (CookieInfo *)newcookies->cookies[1]) {
      pCVar1 = Curl_cookie_init(data,(char *)newcookies->cookies[0],data->cookies,
                                (*(ulong *)&(data->set).field_0x8e2 >> 2 & 1) != 0);
      if (pCVar1 == (CookieInfo *)0x0) {
        Curl_infof(data,"ignoring failed cookie_init for %s",newcookies->cookies[0]);
      }
      else {
        data->cookies = pCVar1;
      }
    }
    curl_slist_free_all((data->state).cookielist);
    (data->state).cookielist = (curl_slist *)0x0;
    Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  }
  return;
}

Assistant:

void Curl_cookie_loadfiles(struct Curl_easy *data)
{
  struct curl_slist *list = data->state.cookielist;
  if(list) {
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
    while(list) {
      struct CookieInfo *newcookies = Curl_cookie_init(data,
                                        list->data,
                                        data->cookies,
                                        data->set.cookiesession);
      if(!newcookies)
        /*
         * Failure may be due to OOM or a bad cookie; both are ignored
         * but only the first should be
         */
        infof(data, "ignoring failed cookie_init for %s", list->data);
      else
        data->cookies = newcookies;
      list = list->next;
    }
    curl_slist_free_all(data->state.cookielist); /* clean up list */
    data->state.cookielist = NULL; /* don't do this again! */
    Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
  }
}